

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O2

void multikey_simd_parallel<unsigned_char>(uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  size_t sVar2;
  unsigned_long N_00;
  byte pivot;
  byte bVar3;
  int iVar4;
  size_t i;
  size_t sVar5;
  void *__src;
  uint8_t *oracle;
  ulong n;
  uchar **strings_00;
  uint8_t *oracle_00;
  ulong uVar6;
  array<unsigned_long,_3UL> bucketsize;
  size_t bucketindex [3];
  
  if (N < 0x20) {
    insertion_sort(strings,(int)N,depth);
    return;
  }
  pivot = pseudo_median<unsigned_char>(strings,N,depth);
  iVar4 = posix_memalign((void **)&bucketsize,0x10,N);
  oracle_00 = (uint8_t *)bucketsize._M_elems[0];
  if (iVar4 != 0) {
    oracle_00 = (uint8_t *)0x0;
  }
  bucketindex[0] = 0;
  std::array<unsigned_long,_3UL>::fill(&bucketsize,bucketindex);
  uVar6 = N & 0xffffffffffffffe0;
  oracle = oracle_00;
  n = uVar6;
  strings_00 = strings;
  if (0x100000 < N) {
    n = uVar6 >> 1;
    calculate_bucketsizes_sse<false>(strings,n,oracle_00,pivot,depth);
    oracle = oracle_00 + n;
    strings_00 = (uchar **)((long)strings + uVar6 * 4);
  }
  calculate_bucketsizes_sse<false>(strings_00,n,oracle,pivot,depth);
  for (; uVar6 < N; uVar6 = uVar6 + 1) {
    bVar3 = get_char<unsigned_char>(strings[uVar6],depth);
    oracle_00[uVar6] = (pivot <= bVar3 && bVar3 != pivot) * '\x02' | bVar3 == pivot;
  }
  for (sVar5 = 0; N_00 = bucketsize._M_elems[0], N != sVar5; sVar5 = sVar5 + 1) {
    bucketsize._M_elems[oracle_00[sVar5]] = bucketsize._M_elems[oracle_00[sVar5]] + 1;
  }
  sVar5 = bucketsize._M_elems[1] + bucketsize._M_elems[0];
  if (bucketsize._M_elems[2] + sVar5 != N) {
    __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                  ,0x1c2,
                  "void multikey_simd_parallel(unsigned char **, size_t, size_t) [CharT = unsigned char]"
                 );
  }
  __src = malloc(N * 8);
  bucketindex[0] = 0;
  bucketindex[1] = N_00;
  bucketindex[2] = sVar5;
  for (sVar5 = 0; N != sVar5; sVar5 = sVar5 + 1) {
    puVar1 = strings[sVar5];
    sVar2 = bucketindex[oracle_00[sVar5]];
    bucketindex[oracle_00[sVar5]] = sVar2 + 1;
    *(uchar **)((long)__src + sVar2 * 8) = puVar1;
  }
  memcpy(strings,__src,N * 8);
  free(__src);
  free(oracle_00);
  multikey_simd_parallel<unsigned_char>(strings,N_00,depth);
  if (pivot != 0) {
    multikey_simd_parallel<unsigned_char>
              (strings + bucketsize._M_elems[0],bucketsize._M_elems[1],depth + 1);
  }
  multikey_simd_parallel<unsigned_char>
            (strings + bucketsize._M_elems[0] + bucketsize._M_elems[1],bucketsize._M_elems[2],depth)
  ;
  return;
}

Assistant:

static void
multikey_simd_parallel(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	uint8_t* const restrict oracle =
		static_cast<uint8_t*>(_mm_malloc(N, 16));
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%32;
	if (N > 0x100000) {
#pragma omp parallel sections
		{
#pragma omp section
		calculate_bucketsizes_sse<false>(strings, i/2, oracle,
				partval, depth);
#pragma omp section
		calculate_bucketsizes_sse<false>(strings+i/2, i/2, oracle+i/2,
				partval, depth);
		}
	} else
		calculate_bucketsizes_sse<false>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i)
		++bucketsize[oracle[i]];
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	unsigned char** sorted =
		static_cast<unsigned char**>(malloc(N*sizeof(unsigned char*)));
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	free(sorted);
	_mm_free(oracle);
#pragma omp parallel sections
	{
#pragma omp section
	multikey_simd_parallel<CharT>(strings, bucketsize[0], depth);
#pragma omp section
	if (not is_end(partval))
		multikey_simd_parallel<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT));
#pragma omp section
	multikey_simd_parallel<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
	}
}